

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_is_prime_ext
              (mbedtls_mpi *X,int rounds,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  int iVar2;
  mbedtls_mpi_uint p [1];
  mbedtls_mpi XX;
  mbedtls_mpi Y;
  mbedtls_mpi_uint local_60;
  mbedtls_mpi local_58;
  mbedtls_mpi local_40;
  
  local_58.s = 1;
  local_58.n = X->n;
  local_58.p = X->p;
  local_60 = 0;
  local_40.s = 1;
  local_40.n = 1;
  local_40.p = &local_60;
  iVar1 = mbedtls_mpi_cmp_mpi(&local_58,&local_40);
  iVar2 = -0xe;
  if (iVar1 != 0) {
    local_60 = 1;
    local_40.s = 1;
    local_40.n = 1;
    local_40.p = &local_60;
    iVar1 = mbedtls_mpi_cmp_mpi(&local_58,&local_40);
    if (iVar1 != 0) {
      local_60 = 2;
      local_40.s = 1;
      local_40.n = 1;
      local_40.p = &local_60;
      iVar1 = mbedtls_mpi_cmp_mpi(&local_58,&local_40);
      iVar2 = 0;
      if (iVar1 != 0) {
        iVar2 = mpi_check_small_factors(&local_58);
        if (iVar2 == 0) {
          iVar2 = mpi_miller_rabin(&local_58,(long)rounds,f_rng,p_rng);
        }
        else if (iVar2 == 1) {
          return 0;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_mpi_is_prime_ext( const mbedtls_mpi *X, int rounds,
                              int (*f_rng)(void *, unsigned char *, size_t),
                              void *p_rng )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi XX;
    MPI_VALIDATE_RET( X     != NULL );
    MPI_VALIDATE_RET( f_rng != NULL );

    XX.s = 1;
    XX.n = X->n;
    XX.p = X->p;

    if( mbedtls_mpi_cmp_int( &XX, 0 ) == 0 ||
        mbedtls_mpi_cmp_int( &XX, 1 ) == 0 )
        return( MBEDTLS_ERR_MPI_NOT_ACCEPTABLE );

    if( mbedtls_mpi_cmp_int( &XX, 2 ) == 0 )
        return( 0 );

    if( ( ret = mpi_check_small_factors( &XX ) ) != 0 )
    {
        if( ret == 1 )
            return( 0 );

        return( ret );
    }

    return( mpi_miller_rabin( &XX, rounds, f_rng, p_rng ) );
}